

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<float,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  unsigned_long *__first;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar7;
  double dVar8;
  __type _Var9;
  long in_stack_00000008;
  int in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  byte *in_stack_00000028;
  size_t *row_1;
  size_t *row;
  size_t nmatches;
  size_t ind_end_col;
  size_t curr_pos;
  size_t nnz_col;
  size_t end_col;
  size_t st_col;
  byte local_d1;
  unsigned_long *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar10;
  unsigned_long *in_stack_ffffffffffffff50;
  double local_90;
  double local_88;
  ulong *local_70;
  ulong *local_68;
  ulong local_60;
  long local_50;
  
  *in_stack_00000018 = INFINITY;
  *in_stack_00000020 = -INFINITY;
  local_50 = *(long *)(in_stack_00000008 + in_RCX * 8);
  lVar1 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
  lVar5 = lVar1 + -1;
  if (((lVar1 == local_50) || (*(long *)(in_RDI + in_RDX * 8) < *(long *)(in_R9 + local_50 * 8))) ||
     (*(long *)(in_R9 + lVar5 * 8) < *(long *)(in_RDI + in_RSI * 8))) {
    *in_stack_00000028 = 1;
    return;
  }
  if ((((ulong)(lVar1 - local_50) < (in_RDX - in_RSI) + 1U) ||
      (*(long *)(in_RDI + in_RSI * 8) < *(long *)(in_R9 + local_50 * 8))) ||
     (*(long *)(in_R9 + lVar5 * 8) < *(long *)(in_RDI + in_RDX * 8))) {
    *in_stack_00000018 = 0.0;
    *in_stack_00000020 = 0.0;
  }
  uVar2 = *(ulong *)(in_R9 + lVar5 * 8);
  local_60 = 0;
  if (in_stack_00000010 == 0) {
    local_68 = std::lower_bound<unsigned_long*,long>
                         (in_stack_ffffffffffffff50,
                          (unsigned_long *)
                          CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                          (long *)in_stack_ffffffffffffff40);
    while( true ) {
      bVar7 = false;
      if ((local_68 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar7 = false, local_50 != lVar1)) {
        bVar7 = *local_68 <= uVar2;
      }
      if (!bVar7) break;
      if (*(ulong *)(in_R9 + local_50 * 8) == *local_68) {
        local_60 = local_60 + 1;
        if (*in_stack_00000018 <= (double)*(float *)(in_R8 + local_50 * 4)) {
          local_88 = *in_stack_00000018;
        }
        else {
          local_88 = (double)*(float *)(in_R8 + local_50 * 4);
        }
        *in_stack_00000018 = local_88;
        dVar8 = (double)*(float *)(in_R8 + local_50 * 4);
        if (dVar8 < *in_stack_00000020 || dVar8 == *in_stack_00000020) {
          local_90 = *in_stack_00000020;
        }
        else {
          local_90 = (double)*(float *)(in_R8 + local_50 * 4);
        }
        *in_stack_00000020 = local_90;
        if ((local_68 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == lVar5)) break;
        local_68 = local_68 + 1;
        plVar6 = std::lower_bound<long*,unsigned_long>
                           ((long *)in_stack_ffffffffffffff50,
                            (long *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40);
        local_50 = (long)plVar6 - in_R9 >> 3;
      }
      else if ((long)*local_68 < *(long *)(in_R9 + local_50 * 8)) {
        local_68 = std::lower_bound<unsigned_long*,long>
                             (in_stack_ffffffffffffff50,
                              (unsigned_long *)
                              CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                              (long *)in_stack_ffffffffffffff40);
      }
      else {
        plVar6 = std::lower_bound<long*,unsigned_long>
                           ((long *)in_stack_ffffffffffffff50,
                            (long *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40);
        local_50 = (long)plVar6 - in_R9 >> 3;
      }
    }
  }
  else {
    __first = std::lower_bound<unsigned_long*,long>
                        (in_stack_ffffffffffffff50,
                         (unsigned_long *)
                         CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                         (long *)in_stack_ffffffffffffff40);
    local_70 = __first;
    while( true ) {
      uVar10 = false;
      if ((local_70 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (uVar10 = false, local_50 != lVar1)) {
        uVar10 = *local_70 <= uVar2;
      }
      if ((bool)uVar10 == false) break;
      if (*(ulong *)(in_R9 + local_50 * 8) == *local_70) {
        local_60 = local_60 + 1;
        _Var9 = std::fmin<double,float>(*in_stack_00000018,*(float *)(in_R8 + local_50 * 4));
        *in_stack_00000018 = _Var9;
        _Var9 = std::fmax<double,float>(*in_stack_00000020,*(float *)(in_R8 + local_50 * 4));
        *in_stack_00000020 = _Var9;
        if ((local_70 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == lVar5)) break;
        local_70 = local_70 + 1;
        in_stack_ffffffffffffff40 =
             (unsigned_long *)
             std::lower_bound<long*,unsigned_long>
                       ((long *)__first,(long *)CONCAT17(uVar10,in_stack_ffffffffffffff48),
                        in_stack_ffffffffffffff40);
        local_50 = (long)in_stack_ffffffffffffff40 - in_R9 >> 3;
      }
      else if ((long)*local_70 < *(long *)(in_R9 + local_50 * 8)) {
        local_70 = std::lower_bound<unsigned_long*,long>
                             (__first,(unsigned_long *)CONCAT17(uVar10,in_stack_ffffffffffffff48),
                              (long *)in_stack_ffffffffffffff40);
      }
      else {
        plVar6 = std::lower_bound<long*,unsigned_long>
                           ((long *)__first,(long *)CONCAT17(uVar10,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40);
        local_50 = (long)plVar6 - in_R9 >> 3;
      }
    }
  }
  if (local_60 < (in_RDX - in_RSI) + 1U) {
    _Var9 = std::fmin<double,int>(*in_stack_00000018,0);
    *in_stack_00000018 = _Var9;
    _Var9 = std::fmax<double,int>(*in_stack_00000020,0);
    *in_stack_00000020 = _Var9;
  }
  local_d1 = 1;
  if ((*in_stack_00000018 != *in_stack_00000020) ||
     (NAN(*in_stack_00000018) || NAN(*in_stack_00000020))) {
    if ((*in_stack_00000018 == INFINITY) && (!NAN(*in_stack_00000018))) {
      local_d1 = 1;
      if ((*in_stack_00000020 == -INFINITY) && (!NAN(*in_stack_00000020))) goto LAB_0052af00;
    }
    uVar3 = std::isnan(*in_stack_00000018);
    local_d1 = 1;
    if ((uVar3 & 1) == 0) {
      iVar4 = std::isnan(*in_stack_00000020);
      local_d1 = (byte)iVar4;
    }
  }
LAB_0052af00:
  *in_stack_00000028 = local_d1 & 1;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}